

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm7tdmi.c
# Opt level: O3

void skip_bios(arm7tdmi_t *state)

{
  status_register_t *psVar1;
  uint uVar2;
  uint32_t *puVar3;
  bool bVar4;
  
  if (gba_log_verbosity < 3) {
    state->r[0] = 0x8000000;
LAB_00106ddd:
    state->r[1] = 0xea;
LAB_00106deb:
    state->r[2] = 0;
LAB_00106df2:
    state->r[3] = 0;
LAB_00106df9:
    state->r[4] = 0;
LAB_00106e00:
    state->r[5] = 0;
LAB_00106e07:
    state->r[6] = 0;
  }
  else {
    printf("[DEBUG] Set r%d to 0x%08X\n",0,0x8000000);
    uVar2 = gba_log_verbosity;
    state->r[0] = 0x8000000;
    if (uVar2 < 3) goto LAB_00106ddd;
    printf("[DEBUG] Set r%d to 0x%08X\n",1,0xea);
    uVar2 = gba_log_verbosity;
    state->r[1] = 0xea;
    if (uVar2 < 3) goto LAB_00106deb;
    printf("[DEBUG] Set r%d to 0x%08X\n",2,0);
    uVar2 = gba_log_verbosity;
    state->r[2] = 0;
    if (uVar2 < 3) goto LAB_00106df2;
    printf("[DEBUG] Set r%d to 0x%08X\n",3,0);
    uVar2 = gba_log_verbosity;
    state->r[3] = 0;
    if (uVar2 < 3) goto LAB_00106df9;
    printf("[DEBUG] Set r%d to 0x%08X\n",4,0);
    uVar2 = gba_log_verbosity;
    state->r[4] = 0;
    if (uVar2 < 3) goto LAB_00106e00;
    printf("[DEBUG] Set r%d to 0x%08X\n",5,0);
    uVar2 = gba_log_verbosity;
    state->r[5] = 0;
    if (uVar2 < 3) goto LAB_00106e07;
    printf("[DEBUG] Set r%d to 0x%08X\n",6,0);
    uVar2 = gba_log_verbosity;
    state->r[6] = 0;
    if (2 < uVar2) {
      printf("[DEBUG] Set r%d to 0x%08X\n",7,0);
      bVar4 = 2 < gba_log_verbosity;
      state->r[7] = 0;
      if (bVar4) {
        printf("[DEBUG] Set r%d to 0x%08X\n",8,0);
      }
      goto LAB_00106e15;
    }
  }
  state->r[7] = 0;
LAB_00106e15:
  psVar1 = &state->cpsr;
  uVar2 = psVar1->raw;
  puVar3 = state->r + 8;
  if ((uVar2 & 0x1f) == 0x11) {
    puVar3 = state->highreg_fiq;
  }
  *puVar3 = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",9,0);
    uVar2 = psVar1->raw;
  }
  puVar3 = state->r + 9;
  if ((uVar2 & 0x1f) == 0x11) {
    puVar3 = state->highreg_fiq + 1;
  }
  *puVar3 = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",10,0);
    uVar2 = psVar1->raw;
  }
  puVar3 = state->r + 10;
  if ((uVar2 & 0x1f) == 0x11) {
    puVar3 = state->highreg_fiq + 2;
  }
  *puVar3 = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xb,0);
    uVar2 = psVar1->raw;
  }
  puVar3 = state->r + 0xb;
  if ((uVar2 & 0x1f) == 0x11) {
    puVar3 = state->highreg_fiq + 3;
  }
  *puVar3 = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xc,0);
    uVar2 = psVar1->raw;
  }
  puVar3 = state->r + 0xc;
  if ((uVar2 & 0x1f) == 0x11) {
    puVar3 = state->highreg_fiq + 4;
  }
  *puVar3 = 0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xd,0x3007f00);
    uVar2 = psVar1->raw;
  }
  switch(uVar2 & 0x1f) {
  case 0x11:
    state->sp_fiq = 0x3007f00;
    break;
  case 0x12:
  case 0x13:
    break;
  default:
    state->sp = 0x3007f00;
    break;
  case 0x17:
    state->sp_abt = 0x3007f00;
    break;
  case 0x1b:
    state->sp_und = 0x3007f00;
  }
  state->sp_irq = 0x3007fa0;
  state->sp_svc = 0x3007fe0;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",0xe,0);
    uVar2 = psVar1->raw;
  }
  switch(uVar2 & 0x1f) {
  case 0x11:
    state->lr_fiq = 0;
    break;
  case 0x12:
    state->lr_irq = 0;
    break;
  case 0x13:
    state->lr_svc = 0;
    break;
  default:
    state->lr = 0;
    break;
  case 0x17:
    state->lr_abt = 0;
    break;
  case 0x1b:
    state->lr_und = 0;
  }
  if ((uVar2 & 0x20) != 0) {
    psVar1->raw = uVar2 & 0xffffffdf;
  }
  state->pc = 0x8000000;
  fill_pipe(state);
  (state->cpsr).raw = 0x6000001f;
  return;
}

Assistant:

void skip_bios(arm7tdmi_t* state) {
    set_register(state, 0, 0x08000000);
    set_register(state, 1, 0x000000EA);
    set_register(state, 2, 0x00000000);
    set_register(state, 3, 0x00000000);
    set_register(state, 4, 0x00000000);
    set_register(state, 5, 0x00000000);
    set_register(state, 6, 0x00000000);
    set_register(state, 7, 0x00000000);
    set_register(state, 8, 0x00000000);
    set_register(state, 9, 0x00000000);
    set_register(state, 10, 0x00000000);
    set_register(state, 11, 0x00000000);
    set_register(state, 12, 0x00000000);
    set_register(state, REG_SP, 0x03007F00);
    state->sp_irq = 0x3007FA0;
    state->sp_svc = 0x3007FE0;
    set_register(state, REG_LR, 0x00000000);

    set_pc(state, 0x08000000);
    state->cpsr.raw = 0x6000001F;
}